

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O3

void __thiscall crnlib::ktx_texture::clear(ktx_texture *this)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  vector<unsigned_char> *pvVar4;
  
  (this->m_header).m_numberOfArrayElements = 0;
  (this->m_header).m_numberOfFaces = 0;
  (this->m_header).m_numberOfMipmapLevels = 0;
  (this->m_header).m_bytesOfKeyValueData = 0;
  (this->m_header).m_glBaseInternalFormat = 0;
  (this->m_header).m_pixelWidth = 0;
  (this->m_header).m_pixelHeight = 0;
  (this->m_header).m_pixelDepth = 0;
  (this->m_header).m_glType = 0;
  (this->m_header).m_glTypeSize = 0;
  (this->m_header).m_glFormat = 0;
  (this->m_header).m_glInternalFormat = 0;
  (this->m_header).m_identifier[0] = '\0';
  (this->m_header).m_identifier[1] = '\0';
  (this->m_header).m_identifier[2] = '\0';
  (this->m_header).m_identifier[3] = '\0';
  (this->m_header).m_identifier[4] = '\0';
  (this->m_header).m_identifier[5] = '\0';
  (this->m_header).m_identifier[6] = '\0';
  (this->m_header).m_identifier[7] = '\0';
  *(undefined8 *)((this->m_header).m_identifier + 8) = 0;
  pvVar4 = (this->m_key_values).m_p;
  if (pvVar4 != (vector<unsigned_char> *)0x0) {
    uVar2 = (ulong)(this->m_key_values).m_size;
    if (uVar2 != 0) {
      lVar3 = 0;
      do {
        pvVar1 = *(void **)((long)&pvVar4->m_p + lVar3);
        if (pvVar1 != (void *)0x0) {
          crnlib_free(pvVar1);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar2 << 4 != lVar3);
      pvVar4 = (this->m_key_values).m_p;
    }
    crnlib_free(pvVar4);
    (this->m_key_values).m_p = (vector<unsigned_char> *)0x0;
    (this->m_key_values).m_size = 0;
    (this->m_key_values).m_capacity = 0;
  }
  pvVar4 = (this->m_image_data).m_p;
  if (pvVar4 != (vector<unsigned_char> *)0x0) {
    uVar2 = (ulong)(this->m_image_data).m_size;
    if (uVar2 != 0) {
      lVar3 = 0;
      do {
        pvVar1 = *(void **)((long)&pvVar4->m_p + lVar3);
        if (pvVar1 != (void *)0x0) {
          crnlib_free(pvVar1);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar2 << 4 != lVar3);
      pvVar4 = (this->m_image_data).m_p;
    }
    crnlib_free(pvVar4);
    (this->m_image_data).m_p = (vector<unsigned_char> *)0x0;
    (this->m_image_data).m_size = 0;
    (this->m_image_data).m_capacity = 0;
  }
  this->m_opposite_endianness = false;
  this->m_block_dim = 0;
  this->m_bytes_per_block = 0;
  return;
}

Assistant:

void clear()
        {
            m_header.clear();
            m_key_values.clear();
            m_image_data.clear();

            m_block_dim = 0;
            m_bytes_per_block = 0;

            m_opposite_endianness = false;
        }